

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

bool __thiscall CmdLineArgsParser::ParseBoolean(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  undefined8 *puVar2;
  char16_t *pcVar3;
  
  WVar1 = *this->pszCurrentArg;
  if ((ushort)WVar1 < 0x2d) {
    if ((WVar1 == L'\0') || (WVar1 == L' ')) {
LAB_001e4f5b:
      return WVar1 != L'-';
    }
  }
  else {
    if (WVar1 == L'-') goto LAB_001e4f5b;
    if (WVar1 == L':') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = L"\':\' not expected with a boolean flag";
      goto LAB_001e4f8d;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar3 = L"Invalid character after boolean flag";
LAB_001e4f8d:
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

bool
CmdLineArgsParser::ParseBoolean()
{
    if (CurChar() == ':')
    {
        throw Exception(_u("':' not expected with a boolean flag"));
    }
    else if (CurChar() != '-' && CurChar() != ' ' && CurChar() != 0)
    {
        throw Exception(_u("Invalid character after boolean flag"));
    }
    else
    {
        return (CurChar() != '-');
    }
}